

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>::copyAppend
          (QGenericArrayOps<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_> *this,
          pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *b,
          pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *e)

{
  qsizetype *pqVar1;
  pair<BuildsMetaMakefileGenerator::Build_*,_ProString> *ppVar2;
  
  if (b != e) {
    ppVar2 = (this->
             super_QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>).
             ptr;
    for (; b < e; b = b + 1) {
      std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>::pair
                (ppVar2 + (this->
                          super_QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>
                          ).size,b);
      pqVar1 = &(this->
                super_QArrayDataPointer<std::pair<BuildsMetaMakefileGenerator::Build_*,_ProString>_>
                ).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }